

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmUnaryOp(ExpressionContext *ctx,VmModule *module,ExprUnaryOp *node)

{
  VmValueType VVar1;
  VmInstruction *value;
  TypeRef *structType;
  VmValue *pVVar2;
  TypeBase *pTVar3;
  SynBase *source;
  VmValue *unaff_RBX;
  VmModule *pVVar4;
  VmType VVar5;
  VmType type;
  TypeBase *pTStackY_30;
  uint uVar6;
  
  value = (VmInstruction *)CompileVm(ctx,module,node->value);
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 1:
    break;
  case 2:
    pVVar4 = (VmModule *)(node->super_ExprBase).source;
    VVar1 = (value->super_VmValue).type.type;
    uVar6 = (value->super_VmValue).type.size;
    if ((uVar6 != 4 || VVar1 != VM_TYPE_INT) &&
       (((VVar1 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar6 != 8)))) {
      __assert_fail("value->type == VmType::Int || value->type == VmType::Double || value->type == VmType::Long"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x2b4,
                    "VmValue *(anonymous namespace)::CreateNeg(VmModule *, SynBase *, VmValue *)");
    }
    source = *(SynBase **)&(value->super_VmValue).type;
    pTVar3 = (value->super_VmValue).type.structType;
    pTStackY_30 = (TypeBase *)0x44;
    goto LAB_00199899;
  case 3:
    pVVar4 = (VmModule *)(node->super_ExprBase).source;
    VVar1 = (value->super_VmValue).type.type;
    uVar6 = (value->super_VmValue).type.size;
    if ((uVar6 != 4 || VVar1 != VM_TYPE_INT) && ((VVar1 != VM_TYPE_LONG || (uVar6 != 8)))) {
      __assert_fail("value->type == VmType::Int || value->type == VmType::Long",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,699,
                    "VmValue *(anonymous namespace)::CreateNot(VmModule *, SynBase *, VmValue *)");
    }
    source = *(SynBase **)&(value->super_VmValue).type;
    pTVar3 = (value->super_VmValue).type.structType;
    pTStackY_30 = (TypeBase *)0x45;
LAB_00199899:
    VVar5.structType = pTStackY_30;
    VVar5._0_8_ = pTVar3;
    value = anon_unknown.dwarf_11cad6::CreateInstruction
                      ((anon_unknown_dwarf_11cad6 *)module,pVVar4,source,VVar5,
                       (VmInstructionType)value,unaff_RBX);
    break;
  case 4:
    pVVar4 = (VmModule *)(node->super_ExprBase).source;
    if (((value->super_VmValue).type.type == VM_TYPE_AUTO_REF) &&
       ((value->super_VmValue).type.size == 0xc)) {
      structType = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
      uVar6 = (uint)unaff_RBX;
      VVar5 = VmType::Pointer(&structType->super_TypeBase);
      type.structType = (TypeBase *)value;
      type._0_8_ = VVar5.structType;
      value = (VmInstruction *)
              anon_unknown.dwarf_11cad6::CreateExtract
                        ((anon_unknown_dwarf_11cad6 *)module,pVVar4,VVar5._0_8_,type,(VmValue *)0x4,
                         uVar6);
    }
    value = (VmInstruction *)
            anon_unknown.dwarf_11cad6::CreateLogicalNot
                      (module,(SynBase *)pVVar4,&value->super_VmValue);
    break;
  default:
    goto switchD_00199826_default;
  }
  if (value != (VmInstruction *)0x0) {
    pVVar2 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,&value->super_VmValue);
    return pVVar2;
  }
switchD_00199826_default:
  __assert_fail("result",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xb37,"VmValue *CompileVmUnaryOp(ExpressionContext &, VmModule *, ExprUnaryOp *)");
}

Assistant:

VmValue* CompileVmUnaryOp(ExpressionContext &ctx, VmModule *module, ExprUnaryOp *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	VmValue *result = NULL;

	switch(node->op)
	{
	case SYN_UNARY_OP_UNKNOWN:
		break;
	case SYN_UNARY_OP_PLUS:
		result = value;
		break;
	case SYN_UNARY_OP_NEGATE:
		result = CreateNeg(module, node->source, value);
		break;
	case SYN_UNARY_OP_BIT_NOT:
		result = CreateNot(module, node->source, value);
		break;
	case SYN_UNARY_OP_LOGICAL_NOT:
		if(value->type == VmType::AutoRef)
		{
			result = CreateLogicalNot(module, node->source, CreateExtract(module, node->source, VmType::Pointer(ctx.GetReferenceType(ctx.typeVoid)), value, 4));
		}
		else
		{
			result = CreateLogicalNot(module, node->source, value);
		}
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}